

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

int save_cb(void *sysdata,void *userdata)

{
  prf_nodeinfo_t *ppVar1;
  bfile_t *in_RSI;
  prf_state_t *in_RDI;
  prf_nodeinfo_t *info;
  prf_node_t *node;
  bfile_t *bfile;
  prf_state_t *state;
  undefined8 in_stack_ffffffffffffffc8;
  bfile_t *bfile_00;
  prf_state_t *ppVar2;
  uint len;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  bfile_00 = (bfile_t *)in_RDI->node;
  if (((*(uint *)&bfile_00->field_0x4 & 1) == 0) && ((*(uint *)&bfile_00->field_0x4 & 0x4000) == 0))
  {
    ppVar2 = in_RDI;
    ppVar1 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30));
    len = (uint)((ulong)ppVar2 >> 0x20);
    if ((ppVar1 == (prf_nodeinfo_t *)0x0) ||
       (ppVar1->save_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
      bf_put_uint16_be(bfile_00,(uint16_t)((ulong)ppVar1 >> 0x30));
      bf_put_uint16_be(bfile_00,(uint16_t)((ulong)ppVar1 >> 0x30));
      if (4 < *(ushort *)&bfile_00->field_0x2) {
        bf_write((bfile_t *)info,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),len);
      }
    }
    else {
      (*ppVar1->save_f)((prf_node_t *)bfile_00,in_RDI,in_RSI);
    }
    iVar3 = 1;
  }
  else {
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

static
int
save_cb(
    void * sysdata,
    void * userdata )
{
    prf_state_t * state;
    bfile_t * bfile;
    prf_node_t * node;
    prf_nodeinfo_t * info;

    state = (prf_state_t *) sysdata;
    bfile = (bfile_t *) userdata;
    node = state->node;

    if ( (node->flags & PRF_NODE_DELETED) != 0 || /* deleted nodes */
         (node->flags & PRF_NODE_VIRTUAL) != 0 )  /* "fake" helper-nodes */
        return PRF_TRAV_SIBLING;

    info = prf_nodeinfo_get( node->opcode );
    if ( (info != NULL) && (info->save_f != NULL) ) {
        (*(info->save_f))( node, state, bfile );
    } else {
        bf_put_uint16_be( bfile, node->opcode );
        bf_put_uint16_be( bfile, node->length );
        if ( node->length > 4 )
            bf_write( bfile, node->data, node->length - 4 );
    }

    return PRF_TRAV_CONTINUE;
}